

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transport_tcp.cpp
# Opt level: O3

ssize_t __thiscall miniros::TransportTCP::write(TransportTCP *this,int __fd,void *__buf,size_t __n)

{
  recursive_mutex *__mutex;
  bool bVar1;
  int iVar2;
  size_t sVar3;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t extraout_RDX_01;
  size_t extraout_RDX_02;
  size_t extraout_RDX_03;
  ulong uVar4;
  undefined4 in_register_00000034;
  string *name;
  _Alloc_hider _Var5;
  string local_40;
  
  name = (string *)CONCAT44(in_register_00000034,__fd);
  __mutex = &this->close_mutex_;
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar2 != 0) {
    std::__throw_system_error(iVar2);
  }
  if (this->closed_ == true) {
    if (console::g_initialized == '\0') {
      console::initialize();
    }
    if (write::loc.initialized_ == false) {
      local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_40,"miniros.transport_tcp","");
      console::initializeLogLocation(&write::loc,&local_40,Debug);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_dataplus._M_p != &local_40.field_2) {
        operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
      }
    }
    if (write::loc.level_ != Debug) {
      console::setLogLocationLevel(&write::loc,Debug);
      console::checkLogLocationEnabled(&write::loc);
    }
    if (write::loc.logger_enabled_ == true) {
      console::print((FilterBase *)0x0,write::loc.logger_,write::loc.level_,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/transport/transport_tcp.cpp"
                     ,0x214,"virtual int32_t miniros::TransportTCP::write(uint8_t *, uint32_t)",
                     "Tried to write on a closed socket [%d]",(ulong)(uint)this->sock_);
    }
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    uVar4 = 0xffffffff;
  }
  else {
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    sVar3 = 0x7fffffff;
    if ((uint)__buf < 0x7fffffff) {
      sVar3 = (ulong)__buf & 0xffffffff;
    }
    _Var5._M_p = (pointer)(ulong)(uint)this->sock_;
    uVar4 = send(this->sock_,name,sVar3,0);
    if ((int)uVar4 < 0) {
      bVar1 = last_socket_error_is_would_block();
      if (bVar1) {
        return 0;
      }
      sVar3 = extraout_RDX;
      if (console::g_initialized == '\0') {
        console::initialize();
        sVar3 = extraout_RDX_00;
      }
      if (write(unsigned_char*,unsigned_int)::loc.initialized_ == false) {
        local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_40,"miniros.transport_tcp","");
        name = &local_40;
        console::initializeLogLocation(&write(unsigned_char*,unsigned_int)::loc,name,Debug);
        sVar3 = extraout_RDX_01;
        _Var5._M_p = local_40._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_40._M_dataplus._M_p != &local_40.field_2) {
          name = (string *)(local_40.field_2._M_allocated_capacity + 1);
          operator_delete(local_40._M_dataplus._M_p,(ulong)name);
          sVar3 = extraout_RDX_02;
        }
      }
      if (write(unsigned_char*,unsigned_int)::loc.level_ != Debug) {
        write((int)_Var5._M_p,name,sVar3);
        sVar3 = extraout_RDX_03;
      }
      if (write(unsigned_char*,unsigned_int)::loc.logger_enabled_ == true) {
        write((int)this + 0x98,name,sVar3);
      }
      (*(this->super_Transport)._vptr_Transport[8])(this);
    }
    uVar4 = uVar4 & 0xffffffff;
  }
  return uVar4;
}

Assistant:

int32_t TransportTCP::write(uint8_t* buffer, uint32_t size)
{
  {
    std::scoped_lock<std::recursive_mutex> lock(close_mutex_);

    if (closed_)
    {
      MINIROS_DEBUG("Tried to write on a closed socket [%d]", sock_);
      return -1;
    }
  }

  MINIROS_ASSERT(size > 0);

  // never write more than INT_MAX since this is the maximum we can report back with the current return type
  uint32_t writesize = std::min<uint32_t>(size, static_cast<uint32_t>(INT_MAX));
  int num_bytes = ::send(sock_, reinterpret_cast<const char*>(buffer), writesize, 0);
  if (num_bytes < 0)
  {
    if ( !last_socket_error_is_would_block() )
    {
      MINIROS_DEBUG("send() on socket [%d] failed with error [%s]", sock_, last_socket_error_string());
      close();
    }
    else
    {
      num_bytes = 0;
    }
  }

  return num_bytes;
}